

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_coc_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  int iVar1;
  OPJ_BYTE *p_buffer;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_comp_no;
  OPJ_UINT32 l_comp_room;
  opj_image_t *l_image;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  long local_50;
  uint local_48;
  OPJ_UINT32 local_44;
  long local_40;
  long local_38;
  long local_30;
  undefined4 in_stack_ffffffffffffffe0;
  OPJ_UINT32 compno;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  opj_bool oVar2;
  
  local_30 = in_RDI + 0x70;
  if (*(int *)(in_RDI + 8) == 0x10) {
    local_50 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
  }
  else {
    local_50 = *(long *)(in_RDI + 0x10);
  }
  local_38 = local_50;
  local_40 = *(long *)(in_RDI + 0x60);
  local_44 = 2;
  if (*(uint *)(local_40 + 0x10) < 0x101) {
    local_44 = 1;
  }
  if (in_EDX < local_44 + 1) {
    opj_event_msg_v2(in_RCX,1,"Error reading COC marker\n");
    oVar2 = 0;
  }
  else {
    iVar1 = in_EDX - (local_44 + 1);
    opj_read_bytes_LE(in_RSI,&local_48,local_44);
    compno = (OPJ_UINT32)((ulong)in_RDI >> 0x20);
    p_buffer = in_RSI + local_44;
    if (local_48 < *(uint *)(local_40 + 0x10)) {
      opj_read_bytes_LE(p_buffer,(OPJ_UINT32 *)
                                 (*(long *)(local_38 + 0x15d0) + (ulong)local_48 * 0x438),1);
      oVar2 = j2k_read_SPCod_SPCoc
                        ((opj_j2k_v2_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),compno,
                         p_buffer + 1,(OPJ_UINT32 *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RCX
                        );
      if (oVar2 == 0) {
        opj_event_msg_v2(in_RCX,1,"Error reading COC marker\n");
        oVar2 = 0;
      }
      else if (iVar1 == 0) {
        oVar2 = 1;
      }
      else {
        opj_event_msg_v2(in_RCX,1,"Error reading COC marker\n");
        oVar2 = 0;
      }
    }
    else {
      opj_event_msg_v2(in_RCX,1,"Error reading COC marker (bad number of components)\n");
      oVar2 = 0;
    }
  }
  return oVar2;
}

Assistant:

opj_bool j2k_read_coc_v2 (
					opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	opj_cp_v2_t *l_cp = NULL;
	opj_tcp_v2_t *l_tcp = NULL;
	opj_image_t *l_image = NULL;
	OPJ_UINT32 l_comp_room;
	OPJ_UINT32 l_comp_no;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ) ? /*FIXME J2K_DEC_STATE_TPH*/
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;
	l_image = p_j2k->m_private_image;

	l_comp_room = l_image->numcomps <= 256 ? 1 : 2;

	/* make sure room is sufficient*/
	if (p_header_size < l_comp_room + 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COC marker\n");
		return OPJ_FALSE;
	}
	p_header_size -= l_comp_room + 1;

	opj_read_bytes(p_header_data,&l_comp_no,l_comp_room);			/* Ccoc */
	p_header_data += l_comp_room;
	if (l_comp_no >= l_image->numcomps) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COC marker (bad number of components)\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_tcp->tccps[l_comp_no].csty,1);			/* Scoc */
	++p_header_data ;

	if (! j2k_read_SPCod_SPCoc(p_j2k,l_comp_no,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COC marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading COC marker\n");
		return OPJ_FALSE;
	}
	return OPJ_TRUE;
}